

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i2cscript.c
# Opt level: O0

int envy_bios_parse_bit_2(envy_bios *bios,envy_bios_bit_entry *bit)

{
  int iVar1;
  int iVar2;
  int err;
  int wantlen;
  envy_bios_i2cscript *i2cscript;
  envy_bios_bit_entry *bit_local;
  envy_bios *bios_local;
  
  (bios->i2cscript).bit = bit;
  if (bit->t_len < 4) {
    fprintf(_stderr,"I2C script table too short: %d < %d\n",(ulong)bit->t_len,4);
    bios_local._4_4_ = -0x16;
  }
  else {
    if (4 < bit->t_len) {
      fprintf(_stderr,"I2C script table longer than expected: %d > %d\n",(ulong)bit->t_len,4);
    }
    iVar1 = bios_u16(bios,(uint)bit->t_offset,&(bios->i2cscript).unk00);
    iVar2 = bios_u16(bios,bit->t_offset + 2,&(bios->i2cscript).script);
    if (iVar2 == 0 && iVar1 == 0) {
      (bios->i2cscript).valid = '\x01';
      bios_local._4_4_ = 0;
    }
    else {
      bios_local._4_4_ = -0xe;
    }
  }
  return bios_local._4_4_;
}

Assistant:

int envy_bios_parse_bit_2 (struct envy_bios *bios, struct envy_bios_bit_entry *bit) {
	struct envy_bios_i2cscript *i2cscript = &bios->i2cscript;
	i2cscript->bit = bit;
	int wantlen = 4;
	if (bit->t_len < wantlen) {
		ENVY_BIOS_ERR("I2C script table too short: %d < %d\n", bit->t_len, wantlen);
		return -EINVAL;
	}
	if (bit->t_len > wantlen)
		ENVY_BIOS_WARN("I2C script table longer than expected: %d > %d\n", bit->t_len, wantlen);
	int err = 0;
	err |= bios_u16(bios, bit->t_offset+0, &i2cscript->unk00);
	err |= bios_u16(bios, bit->t_offset+2, &i2cscript->script);
	if (err)
		return -EFAULT;
	i2cscript->valid = 1;
	return 0;
}